

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderMps.cpp
# Opt level: O0

FilereaderRetcode __thiscall
FilereaderMps::readModelFromFile
          (FilereaderMps *this,HighsOptions *options,string *filename,HighsModel *model)

{
  FreeFormatParserReturnCode FVar1;
  FilereaderRetcode FVar2;
  long in_RCX;
  string *in_RDX;
  long in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names;
  HighsLogOptions *log_options;
  FilereaderRetcode return_code;
  bool warning_issued;
  FreeFormatParserReturnCode result;
  HMpsFF parser;
  HighsHessian *hessian;
  HighsLp *lp;
  HighsInt *in_stack_00000828;
  HighsInt *in_stack_00000830;
  HighsInt in_stack_00000838;
  HighsInt in_stack_0000083c;
  string *in_stack_00000840;
  HighsLogOptions *in_stack_00000848;
  ObjSense *in_stack_00000860;
  double *in_stack_00000868;
  vector<int,_std::allocator<int>_> *in_stack_00000870;
  vector<int,_std::allocator<int>_> *in_stack_00000878;
  vector<double,_std::allocator<double>_> *in_stack_00000880;
  vector<double,_std::allocator<double>_> *in_stack_00000888;
  vector<double,_std::allocator<double>_> *in_stack_00000890;
  vector<double,_std::allocator<double>_> *in_stack_00000898;
  vector<double,_std::allocator<double>_> *in_stack_000008a0;
  vector<double,_std::allocator<double>_> *in_stack_000008a8;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *in_stack_000008b0;
  string *in_stack_000008b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000008c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000008c8;
  HighsInt *in_stack_000008d0;
  vector<int,_std::allocator<int>_> *in_stack_000008d8;
  vector<int,_std::allocator<int>_> *in_stack_000008e0;
  vector<double,_std::allocator<double>_> *in_stack_000008e8;
  HighsInt *in_stack_000008f0;
  bool *in_stack_000008f8;
  HighsInt in_stack_00000900;
  HMpsFF *in_stack_fffffffffffff9b0;
  HighsInt num_name;
  HighsModel *in_stack_fffffffffffffa50;
  string *in_stack_fffffffffffffa58;
  HighsLogOptions *in_stack_fffffffffffffa60;
  HMpsFF *in_stack_fffffffffffffa68;
  string local_518 [32];
  FilereaderRetcode local_4f8;
  byte local_4f1;
  int local_4f0;
  string local_4e0 [36];
  FreeFormatParserReturnCode local_4bc;
  undefined8 local_4b8;
  byte local_4b0;
  long local_68;
  long local_60;
  FilereaderRetcode local_34;
  
  local_68 = in_RCX + 0x398;
  local_60 = in_RCX;
  if ((*(byte *)(in_RSI + 0x211) & 1) != 0) {
    free_format_parser::HMpsFF::HMpsFF(in_stack_fffffffffffff9b0);
    if ((*(double *)(in_RSI + 0x88) <= INFINITY && *(double *)(in_RSI + 0x88) != INFINITY) &&
       (0.0 < *(double *)(in_RSI + 0x88))) {
      local_4b8 = *(undefined8 *)(in_RSI + 0x88);
    }
    std::__cxx11::string::string(local_4e0,in_RDX);
    FVar1 = free_format_parser::HMpsFF::loadProblem
                      (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58
                       ,in_stack_fffffffffffffa50);
    std::__cxx11::string::~string(local_4e0);
    local_4bc = FVar1;
    switch(FVar1) {
    case kSuccess:
      HighsLp::ensureColwise((HighsLp *)0x458660);
      local_34 = (FilereaderRetcode)((local_4b0 & 1) != 0);
      local_4f0 = 1;
      break;
    case kParserError:
      local_34 = kParserError;
      local_4f0 = 1;
      break;
    case kFileNotFound:
      local_34 = kFileNotFound;
      local_4f0 = 1;
      break;
    case kFixedFormat:
      highsLogUser((HighsLogOptions *)(in_RSI + 0x380),kWarning,
                   "Free format reader has detected row/col names with spaces: switching to fixed format parser\n"
                  );
    default:
      local_4f0 = 0;
      break;
    case kTimeout:
      highsLogUser((HighsLogOptions *)(in_RSI + 0x380),kWarning,
                   "Free format reader reached time_limit while parsing the input file\n");
      local_34 = kTimeout;
      local_4f0 = 1;
    }
    free_format_parser::HMpsFF::~HMpsFF(in_stack_fffffffffffff9b0);
    if (local_4f0 != 0) {
      return local_34;
    }
  }
  local_4f1 = *(byte *)(in_RSI + 0x211) & 1;
  std::__cxx11::string::string(local_518,in_RDX);
  names = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(local_60 + 0xc0);
  num_name = (HighsInt)((ulong)(local_60 + 0xd8) >> 0x20);
  log_options = (HighsLogOptions *)(local_60 + 8);
  FVar2 = readMps(in_stack_00000848,in_stack_00000840,in_stack_0000083c,in_stack_00000838,
                  in_stack_00000830,in_stack_00000828,in_stack_00000860,in_stack_00000868,
                  in_stack_00000870,in_stack_00000878,in_stack_00000880,in_stack_00000888,
                  in_stack_00000890,in_stack_00000898,in_stack_000008a0,in_stack_000008a8,
                  in_stack_000008b0,in_stack_000008b8,in_stack_000008c0,in_stack_000008c8,
                  in_stack_000008d0,in_stack_000008d8,in_stack_000008e0,in_stack_000008e8,
                  in_stack_000008f0,in_stack_000008f8,in_stack_00000900);
  std::__cxx11::string::~string(local_518);
  local_4f8 = FVar2;
  if (FVar2 == kOk) {
    HighsLp::ensureColwise((HighsLp *)0x4589d3);
  }
  hasNamesWithSpaces(log_options,num_name,names);
  hasNamesWithSpaces(log_options,num_name,names);
  if ((local_4f8 == kOk) && ((local_4f1 & 1) != 0)) {
    local_4f8 = kWarning;
  }
  return local_4f8;
}

Assistant:

FilereaderRetcode FilereaderMps::readModelFromFile(const HighsOptions& options,
                                                   const std::string filename,
                                                   HighsModel& model) {
  HighsLp& lp = model.lp_;
  HighsHessian& hessian = model.hessian_;
  // if free format parser
  // Parse file and return status.
  if (options.mps_parser_type_free) {
    HMpsFF parser{};
    if (options.time_limit < kHighsInf && options.time_limit > 0)
      parser.time_limit_ = options.time_limit;

    FreeFormatParserReturnCode result =
        parser.loadProblem(options.log_options, filename, model);
    switch (result) {
      case FreeFormatParserReturnCode::kSuccess:
        lp.ensureColwise();
        assert(model.lp_.objective_name_ != "");
        return parser.warning_issued_ ? FilereaderRetcode::kWarning
                                      : FilereaderRetcode::kOk;
      case FreeFormatParserReturnCode::kParserError:
        return FilereaderRetcode::kParserError;
      case FreeFormatParserReturnCode::kFileNotFound:
        return FilereaderRetcode::kFileNotFound;
      case FreeFormatParserReturnCode::kFixedFormat:
        highsLogUser(options.log_options, HighsLogType::kWarning,
                     "Free format reader has detected row/col names with "
                     "spaces: switching to fixed format parser\n");
        break;
      case FreeFormatParserReturnCode::kTimeout:
        highsLogUser(options.log_options, HighsLogType::kWarning,
                     "Free format reader reached time_limit while parsing "
                     "the input file\n");
        return FilereaderRetcode::kTimeout;
    }
  }

  // else use fixed format parser
  //
  // If the fixed format parser has had to be used, then a warning was
  // issued, otherwise no warning has yet been issued
  bool warning_issued = options.mps_parser_type_free;
  FilereaderRetcode return_code =
      readMps(options.log_options, filename, -1, -1, lp.num_row_, lp.num_col_,
              lp.sense_, lp.offset_, lp.a_matrix_.start_, lp.a_matrix_.index_,
              lp.a_matrix_.value_, lp.col_cost_, lp.col_lower_, lp.col_upper_,
              lp.row_lower_, lp.row_upper_, lp.integrality_, lp.objective_name_,
              lp.col_names_, lp.row_names_, hessian.dim_, hessian.start_,
              hessian.index_, hessian.value_, lp.cost_row_location_,
              warning_issued, options.keep_n_rows);
  if (return_code == FilereaderRetcode::kOk) lp.ensureColwise();
  // Comment on existence of names with spaces
  hasNamesWithSpaces(options.log_options, lp.num_col_, lp.col_names_);
  hasNamesWithSpaces(options.log_options, lp.num_row_, lp.row_names_);
  assert(model.lp_.objective_name_ != "");
  if (return_code == FilereaderRetcode::kOk && warning_issued)
    return_code = FilereaderRetcode::kWarning;
  return return_code;
}